

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdPluginLib.h
# Opt level: O0

shared_ptr<NumberGeneratorImpl> __thiscall
plugin::StdPluginLib::AddExtension<NumberGeneratorImpl>(StdPluginLib *this)

{
  NumberGeneratorImpl *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  shared_ptr<NumberGeneratorImpl> sVar1;
  shared_ptr<plugin::interfaces::IPluginInterface> local_40 [2];
  undefined1 local_19;
  StdPluginLib *this_local;
  shared_ptr<NumberGeneratorImpl> *instance;
  
  local_19 = 0;
  this_local = this;
  this_00 = (NumberGeneratorImpl *)operator_new(8);
  NumberGeneratorImpl::NumberGeneratorImpl(this_00);
  std::shared_ptr<NumberGeneratorImpl>::shared_ptr<NumberGeneratorImpl,void>
            ((shared_ptr<NumberGeneratorImpl> *)this,this_00);
  std::shared_ptr<plugin::interfaces::IPluginInterface>::shared_ptr<NumberGeneratorImpl,void>
            (local_40,(shared_ptr<NumberGeneratorImpl> *)this);
  std::
  vector<std::shared_ptr<plugin::interfaces::IPluginInterface>,_std::allocator<std::shared_ptr<plugin::interfaces::IPluginInterface>_>_>
  ::push_back((vector<std::shared_ptr<plugin::interfaces::IPluginInterface>,_std::allocator<std::shared_ptr<plugin::interfaces::IPluginInterface>_>_>
               *)(in_RSI + 8),local_40);
  std::shared_ptr<plugin::interfaces::IPluginInterface>::~shared_ptr(local_40);
  sVar1.super___shared_ptr<NumberGeneratorImpl,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<NumberGeneratorImpl,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<NumberGeneratorImpl>)
         sVar1.super___shared_ptr<NumberGeneratorImpl,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<IFACEIMPL> AddExtension()
        {
            // Using operator new instead of std::make_shared because
            // interface instances have private constructors, and a friend
            // relationship to allow this function to construct them.
            std::shared_ptr<IFACEIMPL> const instance { new IFACEIMPL };
            m_extensions.push_back(instance);
            return instance;
       }